

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.cpp
# Opt level: O2

int modrf_pos(int ord,double *coef,double a,double b,double *val,int invert)

{
  uint uVar1;
  double *pdVar2;
  int iVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double local_78;
  undefined4 local_68;
  undefined4 local_38;
  
  pdVar4 = coef + ord;
  auVar12._8_8_ = b;
  auVar12._0_8_ = a;
  auVar12 = divpd(_DAT_0073f450,auVar12);
  uVar1 = (uint)(invert == 0);
  auVar8._0_8_ = CONCAT44((int)(uVar1 << 0x1f) >> 0x1f,(int)(uVar1 << 0x1f) >> 0x1f);
  auVar8._8_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  auVar8._12_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  dVar6 = auVar12._8_8_;
  dVar7 = (double)(~auVar8._0_8_ & (ulong)auVar12._0_8_ | (ulong)b & auVar8._0_8_);
  dVar9 = (double)(~auVar8._8_8_ & (ulong)dVar6 | (ulong)a & auVar8._8_8_);
  if (invert == 0) {
    pdVar2 = coef + ord;
    dVar10 = *pdVar2;
    dVar11 = dVar10;
    while (pdVar2 = pdVar2 + -1, coef <= pdVar2) {
      dVar10 = dVar10 * dVar7 + *pdVar2;
      dVar11 = dVar11 * dVar9 + *pdVar2;
    }
  }
  else {
    dVar10 = *coef;
    dVar11 = dVar10;
    for (pdVar2 = coef + 1; pdVar2 <= pdVar4; pdVar2 = pdVar2 + 1) {
      dVar10 = dVar10 * dVar7 + *pdVar2;
      dVar11 = dVar11 * dVar9 + *pdVar2;
    }
  }
  if (0.0 < dVar11 * dVar10) {
LAB_00719f04:
    iVar3 = 0;
  }
  else {
    if ((1e-12 <= ABS(dVar11)) && (a = b, dVar6 = auVar12._0_8_, 1e-12 <= ABS(dVar10))) {
      iVar3 = 0;
      dVar13 = dVar11;
      do {
        if (iVar3 == 800) {
          fprintf(_stderr,"modrf overflow on interval %f %f\n",SUB84(dVar9,0),dVar7);
          fprintf(_stderr,"\t b-a = %12.5e\n");
          fprintf(_stderr,"\t fa  = %12.5e\n",SUB84(dVar11,0));
          local_38 = SUB84(dVar10,0);
          fprintf(_stderr,"\t fb  = %12.5e\n",local_38);
          local_68 = SUB84(dVar13,0);
          fprintf(_stderr,"\t fx  = %12.5e\n",local_68);
          if (invert == 0) {
            pdVar2 = coef + ord;
            auVar5._8_8_ = *pdVar2;
            auVar5._0_8_ = *pdVar2;
            while (pdVar2 = pdVar2 + -1, coef <= pdVar2) {
              dVar6 = auVar5._8_8_;
              auVar5._0_8_ = auVar5._0_8_ * dVar7 + *pdVar2;
              auVar5._8_8_ = dVar6 * dVar9 + *pdVar2;
            }
          }
          else {
            auVar5._8_8_ = *coef;
            auVar5._0_8_ = *coef;
            for (pdVar2 = coef + 1; pdVar2 <= pdVar4; pdVar2 = pdVar2 + 1) {
              dVar6 = auVar5._8_8_;
              auVar5._0_8_ = auVar5._0_8_ * dVar7 + *pdVar2;
              auVar5._8_8_ = dVar6 * dVar9 + *pdVar2;
            }
          }
          fprintf(_stderr,"\t true fa = %12.5e\n");
          local_78._0_4_ = auVar5._0_4_;
          fprintf(_stderr,"\t true fb = %12.5e\n",local_78._0_4_);
          local_78 = auVar5._0_8_;
          fprintf(_stderr,"\t gradient= %12.5e\n",
                  SUB84((local_78 - auVar5._8_8_) / (dVar7 - dVar9),0));
          fwrite("Polynomial coefficients\n",0x18,1,_stderr);
          for (; coef <= pdVar4; pdVar4 = pdVar4 + -1) {
            fprintf(_stderr,"\t%12.5e\n",SUB84(*pdVar4,0));
          }
          goto LAB_00719f04;
        }
        a = (dVar9 * dVar10 - dVar7 * dVar11) / (dVar10 - dVar11);
        if (invert == 0) {
          dVar14 = *pdVar4;
          pdVar2 = coef + ord;
          while (pdVar2 = pdVar2 + -1, coef <= pdVar2) {
            dVar14 = dVar14 * a + *pdVar2;
          }
        }
        else {
          dVar14 = *coef;
          for (pdVar2 = coef + 1; pdVar2 <= pdVar4; pdVar2 = pdVar2 + 1) {
            dVar14 = dVar14 * a + *pdVar2;
          }
        }
        dVar6 = a;
        if (((1e-12 < ABS(a)) && (ABS(dVar14 / a) < 1e-12)) || (ABS(dVar14) < 1e-12)) break;
        if (0.0 <= dVar11 * dVar14) {
          dVar11 = dVar14;
          dVar9 = a;
          if (0.0 < dVar13 * dVar14) {
            dVar10 = dVar10 * 0.5;
          }
        }
        else {
          dVar10 = dVar14;
          dVar7 = a;
          if (0.0 < dVar13 * dVar14) {
            dVar11 = dVar11 * 0.5;
          }
        }
        iVar3 = iVar3 + 1;
        dVar13 = dVar14;
        a = dVar9;
        dVar6 = dVar9;
      } while (ABS(dVar9 * 1e-12) <= ABS(dVar7 - dVar9));
    }
    if (invert != 0) {
      a = 1.0 / dVar6;
    }
    *val = a;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int modrf_pos( int ord, double *coef, double a, double b, 
	double *val, int invert)
   {
   int  its;
   double fx, lfx;
   double *fp;
   double *scoef = coef;
   double *ecoef = &coef[ord];
   double fa, fb;

   // Invert the interval if required
   if (invert)
      {
      double temp = a;
      a = 1.0 / b;
      b = 1.0 / temp;
      }

   // Evaluate the polynomial at the end points
   if (invert)
      {
      fb = fa = *scoef;
      for (fp = scoef + 1; fp <= ecoef; fp++) 
         {
         fa = a * fa + *fp;
         fb = b * fb + *fp;
         }
      }
   else
      {
      fb = fa = *ecoef;
      for (fp = ecoef - 1; fp >= scoef; fp--) 
         {
         fa = a * fa + *fp;
         fb = b * fb + *fp;
         }
      }

   // if there is no sign difference the method won't work
   if (fa * fb > 0.0)
      return(0);

   // Return if the values are close to zero already
   if (fabs(fa) < RELERROR) 
      {
      *val = invert ? 1.0/a : a;
      return(1);
      }

   if (fabs(fb) < RELERROR) 
      {
      *val = invert ? 1.0/b : b;
      return(1);
      }

   lfx = fa;

   for (its = 0; its < MAXIT; its++) 
      {
      // Assuming straight line from a to b, find zero
      double x = (fb * a - fa * b) / (fb - fa);

      // Evaluate the polynomial at x
      if (invert)
         {
         fx = *scoef;
         for (fp = scoef + 1; fp <= ecoef; fp++)
            fx = x * fx + *fp;
	 }
      else
         {
         fx = *ecoef;
         for (fp = ecoef - 1; fp >= scoef; fp--)
            fx = x * fx + *fp;
         }

      // Evaluate two stopping conditions
      if (fabs(x) > RELERROR && fabs(fx/x) < RELERROR) 
         {
         *val = invert ? 1.0/x : x;
         return(1);
         }
      else if (fabs(fx) < RELERROR) 
         {
         *val = invert ? 1.0/x : x;
         return(1);
         }

      // Subdivide region, depending on whether fx has same sign as fa or fb
      if ((fa * fx) < 0) 
         {
         b = x;
         fb = fx;
         if ((lfx * fx) > 0)
            fa /= 2;
         } 
      else 
         {
         a = x;
         fa = fx;
         if ((lfx * fx) > 0)
            fb /= 2;
         }

   
      // Return if the difference between a and b is very small
      if (fabs(b-a) < fabs(RELERROR * a))
         {
         *val = invert ? 1.0/a : a;
         return(1);
         }

      lfx = fx;
      }

   //==================================================================
   // This is debugging in case something goes wrong.
   // If we reach here, we have not converged -- give some diagnostics
   //==================================================================

   fprintf(stderr, "modrf overflow on interval %f %f\n", a, b);
   fprintf(stderr, "\t b-a = %12.5e\n", b-a);
   fprintf(stderr, "\t fa  = %12.5e\n", fa);
   fprintf(stderr, "\t fb  = %12.5e\n", fb);
   fprintf(stderr, "\t fx  = %12.5e\n", fx);

   // Evaluate the true values at a and b
   if (invert)
      {
      fb = fa = *scoef;
      for (fp = scoef + 1; fp <= ecoef; fp++)
         {
         fa = a * fa + *fp;
         fb = b * fb + *fp;
         }
      }
   else
      {
      fb = fa = *ecoef;
      for (fp = ecoef - 1; fp >= scoef; fp--) 
         {
         fa = a * fa + *fp;
         fb = b * fb + *fp;
         }
      }

   fprintf(stderr, "\t true fa = %12.5e\n", fa);
   fprintf(stderr, "\t true fb = %12.5e\n", fb);
   fprintf(stderr, "\t gradient= %12.5e\n", (fb-fa)/(b-a));

   // Print out the polynomial
   fprintf(stderr, "Polynomial coefficients\n");
   for (fp = ecoef; fp >= scoef; fp--) 
      fprintf (stderr, "\t%12.5e\n", *fp);

   return(0);
   }